

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O3

double log(double __x)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  undefined8 *in_RDX;
  label_idx_map *in_RSI;
  ostream *in_RDI;
  double extraout_XMM0_Qa;
  char local_61;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  map_by_value((idx_label_map *)&local_60,in_RSI);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (in_RDI,(char *)p_Var3[1]._M_parent,(long)p_Var3[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*in_RDX,in_RDX[1]);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      local_61 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_61,1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return extraout_XMM0_Qa;
}

Assistant:

void log(std::ostream& os, const label_idx_map& labels,
         const std::string& pattern_out) {
    for (auto&& elem : map_by_value(labels)) {
        os << elem.second << " -> " << pattern_out << elem.first << '\n';
    }
}